

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.h
# Opt level: O0

void __thiscall
sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::KcpConnection>_>::onMessage
          (LengthHeaderCodec<std::shared_ptr<sznet::net::KcpConnection>_> *this,
          shared_ptr<sznet::net::KcpConnection> *conn,Buffer *buf,Timestamp receiveTime)

{
  size_t sVar1;
  LogStream *this_00;
  self *this_01;
  element_type *this_02;
  char *pcVar2;
  ulong uVar3;
  SourceFile file;
  allocator local_1049;
  string local_1048 [8];
  string message;
  undefined1 local_1018 [12];
  Logger local_1008;
  int local_34;
  int *piStack_30;
  int32_t len;
  void *data;
  Buffer *buf_local;
  shared_ptr<sznet::net::KcpConnection> *conn_local;
  LengthHeaderCodec<std::shared_ptr<sznet::net::KcpConnection>_> *this_local;
  Timestamp receiveTime_local;
  
  data = buf;
  buf_local = (Buffer *)conn;
  conn_local = (shared_ptr<sznet::net::KcpConnection> *)this;
  this_local = (LengthHeaderCodec<std::shared_ptr<sznet::net::KcpConnection>_> *)
               receiveTime.m_microSecondsSinceEpoch;
  while( true ) {
    sVar1 = Buffer::readableBytes((Buffer *)data);
    if (sVar1 < 4) {
      return;
    }
    piStack_30 = (int *)Buffer::peek((Buffer *)data);
    local_34 = *piStack_30;
    if (local_34 < 0) break;
    sVar1 = Buffer::readableBytes((Buffer *)data);
    if (sVar1 < (long)local_34 + 4U) {
      return;
    }
    Buffer::retrieve((Buffer *)data,4);
    pcVar2 = Buffer::peek((Buffer *)data);
    uVar3 = (ulong)local_34;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1048,pcVar2,uVar3,&local_1049);
    std::allocator<char>::~allocator((allocator<char> *)&local_1049);
    std::
    function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
    ::operator()(&this->m_messageCallback,(shared_ptr<sznet::net::KcpConnection> *)buf_local,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1048,
                 (Timestamp)this_local);
    Buffer::retrieve((Buffer *)data,(long)local_34);
    std::__cxx11::string::~string(local_1048);
  }
  Logger::SourceFile::SourceFile<94>
            ((SourceFile *)local_1018,
             (char (*) [94])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Codec.h"
            );
  file._12_4_ = 0;
  file.m_data = (char *)local_1018._0_8_;
  file.m_size = local_1018._8_4_;
  Logger::Logger(&local_1008,file,0x2b,ERROR);
  this_00 = Logger::stream(&local_1008);
  this_01 = LogStream::operator<<(this_00,"Invalid length ");
  LogStream::operator<<(this_01,local_34);
  Logger::~Logger(&local_1008);
  this_02 = std::
            __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)buf_local);
  KcpConnection::forceClose(this_02);
  return;
}

Assistant:

void onMessage(const TSPTR& conn, Buffer* buf, Timestamp receiveTime)
	{
		// kHeaderLen == 4
		while (buf->readableBytes() >= kHeaderLen)
		{
			// FIXME: use Buffer::peekInt32()
			const void* data = buf->peek();
			// SIGBUS
			const int32_t len = *static_cast<const int32_t*>(data);
			if (len < 0)
			{
				LOG_ERROR << "Invalid length " << len;
				conn->forceClose();
				break;
			}
			else if (buf->readableBytes() >= len + kHeaderLen)
			{
				buf->retrieve(kHeaderLen);
				string message(buf->peek(), len);
				m_messageCallback(conn, message, receiveTime);
				buf->retrieve(len);
			}
			else
			{
				break;
			}
		}
	}